

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.c
# Opt level: O0

uint32_t chck_utf8_codepoint(char *u8)

{
  uint32_t uVar1;
  uint32_t local_2c;
  byte local_25;
  uint32_t local_24;
  uint32_t uStack_20;
  uint8_t i;
  uint32_t cp;
  uint32_t state;
  uint8_t mb;
  char *u8_local;
  
  _state = u8;
  if (u8 == (char *)0x0) {
    __assert_fail("u8",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/unicode/unicode.c"
                  ,0x87,"uint32_t chck_utf8_codepoint(const char *)");
  }
  cp._3_1_ = chck_utf8_mblen(u8);
  uStack_20 = 0;
  local_24 = (uint32_t)*_state;
  local_25 = 0;
  while( true ) {
    if (cp._3_1_ <= local_25) {
      if (cp._3_1_ == 0) {
        local_2c = 0xfffd;
      }
      else {
        local_2c = local_24;
      }
      return local_2c;
    }
    uVar1 = chck_utf8_decode(&stack0xffffffffffffffe0,&local_24,_state[local_25]);
    if (uVar1 == 1) break;
    local_25 = local_25 + 1;
  }
  return 0xfffd;
}

Assistant:

uint32_t
chck_utf8_codepoint(const char u8[4])
{
   assert(u8);

   const uint8_t mb = chck_utf8_mblen(u8);
   uint32_t state = CHCK_UTF8_ACCEPT, cp = u8[0];
   for (uint8_t i = 0; i < mb; ++i) {
      if (chck_utf8_decode(&state, &cp, u8[i]) == CHCK_UTF8_REJECT)
         return CHCK_REPLACEMENT_CHAR;
   }

   return (mb > 0 ? cp : CHCK_REPLACEMENT_CHAR);
}